

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O1

void cvarfunc_vid_renderer(FIntCVar *self)

{
  int iVar1;
  char *format;
  
  iVar1 = self->Value;
  if (iVar1 == currentrenderer) {
    return;
  }
  if (iVar1 == 1) {
    format = "Switching to OpenGL renderer...\n";
  }
  else {
    if (iVar1 != 0) {
      Printf("Unknown renderer (%d).  Falling back to software renderer...\n");
      FBaseCVar::SetGenericRep(&self->super_FBaseCVar,(UCVarValue)0x0,CVAR_Int);
      goto LAB_002f9709;
    }
    format = "Switching to software renderer...\n";
  }
  Printf(format);
LAB_002f9709:
  Printf("You must restart GZDoom to switch the renderer\n");
  return;
}

Assistant:

inline operator int () const { return Value; }